

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::EAMInteractionType::EAMInteractionType
          (EAMInteractionType *this,RealType re,RealType alpha,RealType beta,RealType A,RealType B,
          RealType kappa,RealType lambda)

{
  NonBondedInteractionType *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  _Base_ptr in_XMM2_Qa;
  _Base_ptr in_XMM3_Qa;
  _Base_ptr in_XMM4_Qa;
  size_t in_XMM5_Qa;
  _func_int **in_XMM6_Qa;
  NonBondedInteractionType *in_stack_ffffffffffffffa0;
  
  NonBondedInteractionType::NonBondedInteractionType(in_stack_ffffffffffffffa0);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__EAMInteractionType_00508c70;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x25458f);
  *(undefined4 *)&in_RDI[2].atomTypes_.first = 1;
  NonBondedInteractionType::setEAMZhou(in_RDI);
  *(undefined8 *)&in_RDI[1].properties_.propMap_._M_t._M_impl = in_XMM0_Qa;
  *(undefined8 *)&in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header =
       in_XMM1_Qa;
  in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = in_XMM2_Qa
  ;
  in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = in_XMM3_Qa;
  in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = in_XMM4_Qa;
  in_RDI[1].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = in_XMM5_Qa;
  in_RDI[2]._vptr_NonBondedInteractionType = in_XMM6_Qa;
  return;
}

Assistant:

EAMInteractionType(RealType re, RealType alpha, RealType beta, RealType A,
                       RealType B, RealType kappa, RealType lambda) {
      interactionType_ = eamitZhou;
      setEAMZhou();
      re_     = re;
      alpha_  = alpha;
      beta_   = beta;
      A_      = A;
      B_      = B;
      kappa_  = kappa;
      lambda_ = lambda;
    }